

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_tree_state_base(nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
                      nk_collapse_states *state)

{
  int *piVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  nk_user_font *font;
  nk_rect r;
  nk_rect rect;
  nk_rect r_00;
  char *string;
  nk_widget_layout_states nVar4;
  int iVar5;
  int len;
  long lVar6;
  nk_context *i;
  long lVar7;
  nk_command_buffer *b;
  float fVar8;
  float fVar9;
  float fVar10;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect r_01;
  nk_rect b_00;
  nk_rect header;
  nk_flags ws;
  nk_text text;
  nk_rect local_c8;
  nk_flags local_b0;
  float local_ac;
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  nk_collapse_states *local_78;
  char *local_70;
  nk_text local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  local_c8.w = 0.0;
  local_c8.h = 0.0;
  local_b0 = 0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4721,
                  "int nk_tree_state_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, enum nk_collapse_states *)"
                 );
  }
  pnVar2 = ctx->current;
  if (pnVar2 != (nk_window *)0x0) {
    pnVar3 = pnVar2->layout;
    local_78 = state;
    local_70 = title;
    if (pnVar3 != (nk_panel *)0x0) {
      b = &pnVar2->buffer;
      local_88 = (ctx->style).window.spacing.x;
      local_ac = (ctx->style).window.spacing.y;
      fVar8 = (ctx->style).tab.padding.y;
      fVar8 = fVar8 + fVar8 + ((ctx->style).font)->height;
      _local_a8 = CONCAT44(fStack_a4,fVar8);
      nk_layout_set_min_row_height(ctx,fVar8);
      nk_row_layout(ctx,NK_DYNAMIC,local_a8,1,0);
      nk_layout_reset_min_row_height(ctx);
      nVar4 = nk_widget(&local_c8,ctx);
      if (type == NK_TREE_TAB) {
        if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
          r.y = local_c8.y;
          r.x = local_c8.x;
          r.w = local_c8.w;
          r.h = local_c8.h;
          nk_draw_image(b,r,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
          local_68.background.r = '\0';
          local_68.background.g = '\0';
          local_68.background.b = '\0';
          local_68.background.a = '\0';
        }
        else {
          local_68.background = (ctx->style).tab.background.data.color;
          rect.y = local_c8.y;
          rect.x = local_c8.x;
          rect.w = local_c8.w;
          rect.h = local_c8.h;
          nk_fill_rect(b,rect,0.0,(ctx->style).tab.border_color);
          fVar8 = (ctx->style).tab.border;
          fVar10 = fVar8 + fVar8;
          fVar9 = fVar10;
          if (fVar10 <= local_c8.w) {
            fVar9 = local_c8.w;
          }
          if (fVar10 <= local_c8.h) {
            fVar10 = local_c8.h;
          }
          rect_00.x = fVar8 + local_c8.x;
          rect_00.w = fVar9 + fVar8 * -2.0;
          rect_00.y = local_c8.y + fVar8;
          rect_00.h = fVar8 * -2.0 + fVar10;
          nk_fill_rect(b,rect_00,(ctx->style).tab.rounding,(ctx->style).tab.background.data.color);
        }
      }
      else {
        local_68.background = (ctx->style).window.background;
      }
      i = (nk_context *)0x0;
      if (nVar4 == NK_WIDGET_VALID && (pnVar3->flags & 0x1000) == 0) {
        i = ctx;
      }
      r_00.y = local_c8.y;
      r_00.x = local_c8.x;
      r_00.w = local_c8.w;
      r_00.h = local_c8.h;
      iVar5 = nk_button_behavior(&local_b0,r_00,&i->input,NK_BUTTON_DEFAULT);
      if (iVar5 != 0) {
        *local_78 = (uint)(*local_78 != NK_MAXIMIZED);
      }
      lVar6 = 0x1928;
      if (type == NK_TREE_TAB) {
        lVar6 = 0x17c8;
      }
      lVar7 = 0x19d8;
      if (type == NK_TREE_TAB) {
        lVar7 = 0x1878;
      }
      if (*local_78 == NK_MAXIMIZED) {
        lVar7 = lVar6;
      }
      font = (ctx->style).font;
      fVar8 = font->height;
      local_48 = ZEXT416((uint)fVar8);
      fStack_a4 = local_c8.y + (ctx->style).tab.padding.y;
      bounds.x = local_c8.x + (ctx->style).tab.padding.x;
      local_58 = ZEXT416((uint)bounds.x);
      iVar5 = 0;
      uStack_a0 = 0;
      local_98 = CONCAT44(fVar8,fVar8);
      uStack_90 = CONCAT44(fVar8,fVar8);
      bounds.y = fStack_a4;
      bounds.h = fVar8;
      bounds.w = fVar8;
      local_a8 = bounds.x;
      nk_do_button_symbol(&local_b0,b,bounds,
                          (&(ctx->style).tab.sym_minimize)[*local_78 == NK_MAXIMIZED],
                          NK_BUTTON_DEFAULT,
                          (nk_style_button *)((long)&(ctx->input).keyboard.keys[0].down + lVar7),
                          (nk_input *)0x0,font);
      if (img == (nk_image *)0x0) {
      }
      else {
        local_a8 = local_88 * 4.0 + (float)local_48._0_4_ + (float)local_58._0_4_;
        r_01.y = fStack_a4;
        r_01.x = local_a8;
        r_01.w = (float)local_98;
        r_01.h = (float)local_98._4_4_;
        nk_draw_image(b,r_01,img,(nk_color)0xffffffff);
        local_98._0_4_ = ((ctx->style).font)->height + (ctx->style).tab.spacing.x;
      }
      string = local_70;
      fVar8 = local_88 + (float)local_98;
      if (local_88 + (float)local_98 <= local_c8.w) {
        fVar8 = local_c8.w;
      }
      local_88 = local_a8 + (float)local_98 + local_88;
      fStack_84 = fStack_a4;
      uStack_80 = (undefined4)uStack_a0;
      uStack_7c = uStack_a0._4_4_;
      local_68.text = (ctx->style).tab.text;
      local_98 = CONCAT44(((ctx->style).font)->height,
                          fVar8 - (local_ac + (float)local_98 + (ctx->style).tab.indent));
      uStack_90 = 0;
      local_68.padding.x = 0.0;
      local_68.padding.y = 0.0;
      local_c8.w = fVar8;
      len = nk_strlen(local_70);
      b_00.y = fStack_a4;
      b_00.x = local_88;
      b_00.w = (float)local_98;
      b_00.h = (float)local_98._4_4_;
      nk_widget_text(b,b_00,string,len,&local_68,0x11,(ctx->style).font);
      if (*local_78 == NK_MAXIMIZED) {
        fVar8 = (ctx->style).tab.indent;
        pnVar3->at_x = (float)*pnVar3->offset_x + local_c8.x + fVar8;
        fVar9 = (pnVar3->bounds).w;
        fVar10 = fVar8;
        if (fVar8 <= fVar9) {
          fVar10 = fVar9;
        }
        (pnVar3->bounds).w = fVar10;
        (pnVar3->bounds).w = fVar10 - (fVar8 + (ctx->style).window.padding.x);
        piVar1 = &(pnVar3->row).tree_depth;
        *piVar1 = *piVar1 + 1;
        iVar5 = 1;
      }
      return iVar5;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4723,
                  "int nk_tree_state_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, enum nk_collapse_states *)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x4722,
                "int nk_tree_state_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, enum nk_collapse_states *)"
               );
}

Assistant:

NK_INTERN int
nk_tree_state_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, enum nk_collapse_states *state)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_command_buffer *out;
    const struct nk_input *in;
    const struct nk_style_button *button;
    enum nk_symbol_type symbol;
    float row_height;

    struct nk_vec2 item_spacing;
    struct nk_rect header = {0,0,0,0};
    struct nk_rect sym = {0,0,0,0};
    struct nk_text text;

    nk_flags ws = 0;
    enum nk_widget_layout_states widget_state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* cache some data */
    win = ctx->current;
    layout = win->layout;
    out = &win->buffer;
    style = &ctx->style;
    item_spacing = style->window.spacing;

    /* calculate header bounds and draw background */
    row_height = style->font->height + 2 * style->tab.padding.y;
    nk_layout_set_min_row_height(ctx, row_height);
    nk_layout_row_dynamic(ctx, row_height, 1);
    nk_layout_reset_min_row_height(ctx);

    widget_state = nk_widget(&header, ctx);
    if (type == NK_TREE_TAB) {
        const struct nk_style_item *background = &style->tab.background;
        if (background->type == NK_STYLE_ITEM_IMAGE) {
            nk_draw_image(out, header, &background->data.image, nk_white);
            text.background = nk_rgba(0,0,0,0);
        } else {
            text.background = background->data.color;
            nk_fill_rect(out, header, 0, style->tab.border_color);
            nk_fill_rect(out, nk_shrink_rect(header, style->tab.border),
                style->tab.rounding, background->data.color);
        }
    } else text.background = style->window.background;

    /* update node state */
    in = (!(layout->flags & NK_WINDOW_ROM)) ? &ctx->input: 0;
    in = (in && widget_state == NK_WIDGET_VALID) ? &ctx->input : 0;
    if (nk_button_behavior(&ws, header, in, NK_BUTTON_DEFAULT))
        *state = (*state == NK_MAXIMIZED) ? NK_MINIMIZED : NK_MAXIMIZED;

    /* select correct button style */
    if (*state == NK_MAXIMIZED) {
        symbol = style->tab.sym_maximize;
        if (type == NK_TREE_TAB)
            button = &style->tab.tab_maximize_button;
        else button = &style->tab.node_maximize_button;
    } else {
        symbol = style->tab.sym_minimize;
        if (type == NK_TREE_TAB)
            button = &style->tab.tab_minimize_button;
        else button = &style->tab.node_minimize_button;
    }

    {/* draw triangle button */
    sym.w = sym.h = style->font->height;
    sym.y = header.y + style->tab.padding.y;
    sym.x = header.x + style->tab.padding.x;
    nk_do_button_symbol(&ws, &win->buffer, sym, symbol, NK_BUTTON_DEFAULT,
        button, 0, style->font);

    if (img) {
        /* draw optional image icon */
        sym.x = sym.x + sym.w + 4 * item_spacing.x;
        nk_draw_image(&win->buffer, sym, img, nk_white);
        sym.w = style->font->height + style->tab.spacing.x;}
    }

    {/* draw label */
    struct nk_rect label;
    header.w = NK_MAX(header.w, sym.w + item_spacing.x);
    label.x = sym.x + sym.w + item_spacing.x;
    label.y = sym.y;
    label.w = header.w - (sym.w + item_spacing.y + style->tab.indent);
    label.h = style->font->height;
    text.text = style->tab.text;
    text.padding = nk_vec2(0,0);
    nk_widget_text(out, label, title, nk_strlen(title), &text,
        NK_TEXT_LEFT, style->font);}

    /* increase x-axis cursor widget position pointer */
    if (*state == NK_MAXIMIZED) {
        layout->at_x = header.x + (float)*layout->offset_x + style->tab.indent;
        layout->bounds.w = NK_MAX(layout->bounds.w, style->tab.indent);
        layout->bounds.w -= (style->tab.indent + style->window.padding.x);
        layout->row.tree_depth++;
        return nk_true;
    } else return nk_false;
}